

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O2

void __thiscall
lazyTrees::LazyKdTree<Point2D>::LazyKdTree
          (LazyKdTree<Point2D> *this,vector<Point2D,_std::allocator<Point2D>_> *in,int dimension)

{
  pointer pPVar1;
  _Head_base<0UL,_std::vector<Point2D,_std::allocator<Point2D>_>_*,_false> _Var2;
  
  _Var2._M_head_impl = (vector<Point2D,_std::allocator<Point2D>_> *)operator_new(0x18);
  pPVar1 = (in->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)&(_Var2._M_head_impl)->super__Vector_base<Point2D,_std::allocator<Point2D>_> =
       (in->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)
   ((long)&(_Var2._M_head_impl)->super__Vector_base<Point2D,_std::allocator<Point2D>_> + 8) = pPVar1
  ;
  *(pointer *)
   ((long)&(_Var2._M_head_impl)->super__Vector_base<Point2D,_std::allocator<Point2D>_> + 0x10) =
       (in->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (in->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->inputData)._M_t.
  super___uniq_ptr_impl<std::vector<Point2D,_std::allocator<Point2D>_>,_std::default_delete<std::vector<Point2D,_std::allocator<Point2D>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<Point2D,_std::allocator<Point2D>_>_*,_std::default_delete<std::vector<Point2D,_std::allocator<Point2D>_>_>_>
  .super__Head_base<0UL,_std::vector<Point2D,_std::allocator<Point2D>_>_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  (this->childNegative)._M_t.
  super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
  .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl =
       (LazyKdTree<Point2D> *)0x0;
  (this->childPositive)._M_t.
  super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
  .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl =
       (LazyKdTree<Point2D> *)0x0;
  (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
  super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
  super__Head_base<0UL,_Point2D_*,_false>._M_head_impl = (Point2D *)0x0;
  this->dim = (ulong)(dimension & 1);
  throw_if_input_empty(this);
  return;
}

Assistant:

LazyKdTree(std::vector<P>&& in, int dimension = 0)
        : inputData(new std::vector<P>(std::move(in)))
        , childNegative(nullptr)
        , childPositive(nullptr)
        , data(nullptr)
        , dim(dimension % P::dimensions())
    {
      throw_if_input_empty();
    }